

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

void __thiscall
ParserContext::addCommit
          (ParserContext *this,TripleSymbol *sym,int4 num,uintm mask,bool flow,ConstructState *point
          )

{
  reference pvVar1;
  ContextSet *set;
  ConstructState *local_30;
  ConstructState *point_local;
  uintm local_20;
  int4 iStack_1c;
  bool flow_local;
  uintm mask_local;
  int4 num_local;
  TripleSymbol *sym_local;
  ParserContext *this_local;
  
  local_30 = point;
  point_local._7_1_ = flow;
  local_20 = mask;
  iStack_1c = num;
  _mask_local = sym;
  sym_local = (TripleSymbol *)this;
  memset(&set,0,0x20);
  std::vector<ContextSet,_std::allocator<ContextSet>_>::push_back
            (&this->contextcommit,(value_type *)&set);
  pvVar1 = std::vector<ContextSet,_std::allocator<ContextSet>_>::back(&this->contextcommit);
  pvVar1->sym = _mask_local;
  pvVar1->point = local_30;
  pvVar1->num = iStack_1c;
  pvVar1->mask = local_20;
  pvVar1->value = this->context[iStack_1c] & local_20;
  pvVar1->flow = (bool)(point_local._7_1_ & 1);
  return;
}

Assistant:

void ParserContext::addCommit(TripleSymbol *sym,int4 num,uintm mask,bool flow,ConstructState *point)

{
  contextcommit.push_back(ContextSet());
  ContextSet &set(contextcommit.back());

  set.sym = sym;
  set.point = point;		// This is the current state
  set.num = num;
  set.mask = mask;
  set.value = context[num] & mask;
  set.flow = flow;
}